

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

float trng::math::detail::GammaP_ser<float,true>(float a,float x)

{
  uint uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar3 = 0.0;
  if (4.7683716e-07 <= x) {
    fVar4 = 1.0 / a;
    fVar5 = a;
    fVar3 = fVar4;
    uVar1 = 0;
    do {
      fVar5 = fVar5 + 1.0;
      fVar4 = (x / fVar5) * fVar4;
      fVar3 = fVar3 + fVar4;
      if (ABS(fVar4) <= ABS(fVar3) * 4.7683716e-07) break;
      bVar2 = uVar1 < 0x17;
      uVar1 = uVar1 + 1;
    } while (bVar2);
    fVar5 = logf(x);
    fVar4 = lgammaf(a);
    fVar5 = expf((fVar5 * a - x) - fVar4);
    fVar3 = fVar3 * fVar5;
  }
  return fVar3;
}

Assistant:

TRNG_CUDA_ENABLE T GammaP_ser(T a, T x) {
        const int itmax{numeric_limits<T>::digits};
        const T eps{4 * numeric_limits<T>::epsilon()};
        if (x < eps)
          return T{0};
        T xx{1 / a}, n{a}, sum{xx};
        int i{0};
        do {
          ++n;
          ++i;
          xx *= x / n;
          sum += xx;
        } while (abs(xx) > eps * abs(sum) and i < itmax);
#if __cplusplus >= 201703L
        if constexpr (by_Gamma_a)
#else
        if (by_Gamma_a)
#endif
          return exp(-x + a * ln(x) - ln_Gamma(a)) * sum;
        else
          return exp(-x + a * ln(x)) * sum;
      }